

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> * __thiscall
pbrt::ParameterDictionary::extractSpectrumArray
          (vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
           *__return_storage_ptr__,ParameterDictionary *this,ParsedParameter *param,
          SpectrumType spectrumType,Allocator alloc)

{
  double dVar1;
  double *pdVar2;
  size_type sVar3;
  Allocator alloc_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  void *pvVar7;
  size_t sVar8;
  int iVar9;
  RGBSpectrum *this_00;
  ulong uVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar11;
  undefined4 extraout_var_02;
  iterator iVar12;
  mapped_type *pmVar13;
  RGBColorSpace *cs;
  uintptr_t uVar14;
  ulong uVar15;
  string *name;
  char *fmt;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  size_type sVar20;
  long lVar21;
  size_t i;
  undefined1 auVar22 [16];
  span<const_float> l;
  span<const_float> v;
  string fn;
  vector<float,_std::allocator<float>_> value;
  undefined1 local_250 [12];
  undefined4 uStack_244;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  memory_resource *local_230;
  ParameterDictionary *local_228;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_220;
  PiecewiseLinearSpectrum local_218;
  ParsedParameter local_1d8;
  ParsedParameter local_108;
  memory_resource **local_38;
  undefined4 extraout_var;
  
  local_230 = alloc.memoryResource;
  local_228 = this;
  iVar9 = std::__cxx11::string::compare((char *)param);
  if ((iVar9 == 0) ||
     ((*(char *)(Options + 0xb) == '\x01' &&
      (iVar9 = std::__cxx11::string::compare((char *)param), iVar9 == 0)))) {
    local_218.lambdas.alloc.memoryResource._0_4_ = 3;
    uVar15 = (param->numbers).nStored;
    if (uVar15 == 0) {
      ErrorExit<std::__cxx11::string_const&>
                (&param->loc,"No values provided for \"%s\".",&param->name);
    }
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar15;
    if (0x5555555555555555 < SUB168(auVar6 * ZEXT816(0xaaaaaaaaaaaaaaab),0)) {
      ErrorExit<std::__cxx11::string_const&,int&>
                (&param->loc,"Number of values provided for \"%s\" not a multiple of %d",
                 &param->name,(int *)&local_218);
    }
    param->lookedUp = true;
    std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
              (__return_storage_ptr__,uVar15 / 3,(allocator_type *)local_250);
    if (2 < uVar15) {
      lVar21 = 2;
      uVar11 = 0;
      do {
        pdVar2 = (param->numbers).ptr;
        dVar1 = pdVar2[lVar21];
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar1;
        auVar6 = *(undefined1 (*) [16])(pdVar2 + lVar21 + -2);
        auVar4 = vcvtpd2ps_avx(auVar6);
        local_250._8_4_ = (undefined4)dVar1;
        local_250._0_8_ = vmovlpd_avx(auVar4);
        cs = param->colorSpace;
        if (cs == (RGBColorSpace *)0x0) {
          cs = local_228->colorSpace;
        }
        if (spectrumType == General) {
          auVar4 = vshufpd_avx(auVar6,auVar6,1);
          auVar6 = vminsd_avx(auVar4,auVar6);
          auVar6 = vminsd_avx(auVar22,auVar6);
          if (auVar6._0_8_ < 0.0) {
            ErrorExit(&param->loc,"RGB parameter \"%s\" has negative component value.");
          }
          iVar9 = (*local_230->_vptr_memory_resource[2])(local_230,0x28,8);
          this_00 = (RGBSpectrum *)CONCAT44(extraout_var_00,iVar9);
          RGBSpectrum::RGBSpectrum(this_00,cs,(RGB *)local_250);
          uVar10 = 0x4000000000000;
        }
        else {
          if (spectrumType != Reflectance) {
            LogFatal<char_const(&)[38]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/paramdict.cpp"
                       ,0x186,"Check failed: %s",
                       (char (*) [38])"spectrumType == SpectrumType::General");
          }
          auVar5 = vshufpd_avx(auVar6,auVar6,1);
          auVar4 = vminsd_avx(auVar5,auVar6);
          auVar4 = vminsd_avx(auVar22,auVar4);
          if (auVar4._0_8_ < 0.0) {
LAB_003e76d9:
            ErrorExit<std::__cxx11::string_const&>
                      (&param->loc,
                       "RGB reflectance parameter \"%s\" has parameter outside of [0,1].",
                       &param->name);
          }
          auVar6 = vmaxsd_avx(auVar5,auVar6);
          auVar6 = vmaxsd_avx(auVar22,auVar6);
          if (1.0 < auVar6._0_8_) goto LAB_003e76d9;
          iVar9 = (*local_230->_vptr_memory_resource[2])(local_230,0x1c,4);
          this_00 = (RGBSpectrum *)CONCAT44(extraout_var,iVar9);
          RGBReflectanceSpectrum::RGBReflectanceSpectrum
                    ((RGBReflectanceSpectrum *)this_00,cs,(RGB *)local_250);
          uVar10 = 0x5000000000000;
        }
        lVar21 = lVar21 + 3;
        (__return_storage_ptr__->
        super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar11].
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
        .bits = (ulong)this_00 | uVar10;
        uVar11 = uVar11 + 1;
      } while (uVar15 / 3 != uVar11);
    }
  }
  else {
    iVar9 = std::__cxx11::string::compare((char *)param);
    if (iVar9 == 0) {
      sVar3 = (param->numbers).nStored;
      if (sVar3 == 0) {
        fmt = "No values provided for \"%s\".";
LAB_003e77bd:
        ErrorExit<std::__cxx11::string_const&>(&param->loc,fmt,&param->name);
      }
      param->lookedUp = true;
      std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                (__return_storage_ptr__,sVar3,(allocator_type *)local_250);
      sVar20 = 0;
      do {
        pdVar2 = (param->numbers).ptr;
        iVar9 = (*local_230->_vptr_memory_resource[2])(local_230,8,4);
        BlackbodySpectrum::BlackbodySpectrum
                  ((BlackbodySpectrum *)CONCAT44(extraout_var_01,iVar9),(float)pdVar2[sVar20]);
        (__return_storage_ptr__->
        super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
        super__Vector_impl_data._M_start[sVar20].
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
        .bits = CONCAT44(extraout_var_01,iVar9) | 0x6000000000000;
        sVar20 = sVar20 + 1;
      } while (sVar3 != sVar20);
    }
    else {
      iVar9 = std::__cxx11::string::compare((char *)param);
      if ((iVar9 == 0) && (uVar15 = (param->numbers).nStored, uVar15 != 0)) {
        if ((uVar15 & 1) != 0) {
          fmt = "Found odd number of values for \"%s\"";
          goto LAB_003e77bd;
        }
        local_218.values.ptr = (float *)local_228;
        local_218.values.nStored = (size_t)&local_230;
        local_218.values.nAlloc._0_4_ = (int)(uVar15 >> 1);
        ParsedParameter::ParsedParameter(&local_1d8,param);
        local_218.values.alloc.memoryResource._4_4_ = (int)uVar15;
        uVar15 = (param->numbers).nStored;
        if (uVar15 == 0) {
          ErrorExit<std::__cxx11::string_const&>
                    (&param->loc,"No values provided for \"%s\".",&param->name);
        }
        local_218.lambdas.nStored = (size_t)local_218.values.alloc.memoryResource._4_4_;
        uVar11 = uVar15 / local_218.lambdas.nStored;
        if (uVar15 % local_218.lambdas.nStored != 0) {
          ErrorExit<std::__cxx11::string_const&,int&>
                    (&param->loc,"Number of values provided for \"%s\" not a multiple of %d",
                     &param->name,(int *)((long)&local_218.values.alloc.memoryResource + 4));
        }
        param->lookedUp = true;
        std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                  (__return_storage_ptr__,uVar11,(allocator_type *)local_250);
        if (local_218.lambdas.nStored <= uVar15) {
          lVar21 = 0;
          uVar15 = 0;
          local_228 = (ParameterDictionary *)(local_218.lambdas.nStored * 8);
          do {
            pdVar2 = (param->numbers).ptr;
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)local_250,
                       (long)(int)local_218.values.nAlloc,(allocator_type *)&local_218);
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_218,
                       (long)(int)local_218.values.nAlloc,(allocator_type *)&local_220);
            sVar8 = local_218.values.nStored;
            if (0 < (long)(int)local_218.values.nAlloc) {
              lVar16 = 4;
              iVar9 = -1;
              lVar17 = 0;
              lVar18 = 0;
              do {
                if (lVar18 == 0) {
                  dVar1 = pdVar2[uVar15 * local_218.lambdas.nStored];
                  lVar19 = 0;
                }
                else {
                  dVar1 = *(double *)((long)pdVar2 + lVar18 * 8 + lVar21);
                  lVar19 = lVar18;
                  if (dVar1 <= (double)*(float *)(local_250._0_8_ + lVar18 * 2 + -4)) {
                    local_220.bits._0_4_ = iVar9;
                    ErrorExit<int,float&,double_const&>
                              (&local_1d8.loc,
                               "Spectrum description invalid: at %d\'th entry, wavelengths aren\'t increasing: %f >= %f."
                               ,(int *)&local_220,(float *)(local_250._0_8_ + -lVar16),
                               (double *)((long)pdVar2 + (lVar21 - lVar17)));
                  }
                }
                lVar16 = lVar16 + -4;
                iVar9 = iVar9 + 1;
                lVar17 = lVar17 + -0x10;
                *(float *)(local_250._0_8_ + lVar18 * 2) = (float)dVar1;
                *(float *)(CONCAT44(local_218.lambdas.alloc.memoryResource._4_4_,
                                    local_218.lambdas.alloc.memoryResource._0_4_) + lVar18 * 2) =
                     (float)(pdVar2 + uVar15 * local_218.lambdas.nStored)[lVar19 + 1];
                lVar18 = lVar18 + 2;
              } while ((long)(int)local_218.values.nAlloc * 2 != lVar18);
            }
            iVar9 = (*(*(memory_resource **)local_218.values.nStored)->_vptr_memory_resource[2])
                              (*(memory_resource **)local_218.values.nStored,0x40,8);
            l.n = CONCAT44(uStack_244,local_250._8_4_) - local_250._0_8_ >> 2;
            v.n = CONCAT71(local_218.lambdas.ptr._1_7_,(char)local_218.lambdas.ptr) -
                  (long)CONCAT44(local_218.lambdas.alloc.memoryResource._4_4_,
                                 local_218.lambdas.alloc.memoryResource._0_4_) >> 2;
            l.ptr = (float *)local_250._0_8_;
            v.ptr = (float *)CONCAT44(local_218.lambdas.alloc.memoryResource._4_4_,
                                      local_218.lambdas.alloc.memoryResource._0_4_);
            PiecewiseLinearSpectrum::PiecewiseLinearSpectrum
                      ((PiecewiseLinearSpectrum *)CONCAT44(extraout_var_02,iVar9),l,v,
                       *(memory_resource **)sVar8);
            pvVar7 = (void *)CONCAT44(local_218.lambdas.alloc.memoryResource._4_4_,
                                      local_218.lambdas.alloc.memoryResource._0_4_);
            if (pvVar7 != (void *)0x0) {
              operator_delete(pvVar7,local_218.lambdas.nAlloc - (long)pvVar7);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete((void *)local_250._0_8_,
                              local_240._M_allocated_capacity - local_250._0_8_);
            }
            lVar21 = (long)&(local_228->params).alloc.memoryResource + lVar21;
            (__return_storage_ptr__->
            super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl
            .super__Vector_impl_data._M_start[uVar15].
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
            .bits = CONCAT44(extraout_var_02,iVar9) | 0x3000000000000;
            uVar15 = uVar15 + 1;
          } while (uVar15 < uVar11);
        }
        local_1d8.bools.nStored = 0;
        (*(local_1d8.bools.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_1d8.bools.alloc.memoryResource,local_1d8.bools.ptr,local_1d8.bools.nAlloc,1
                  );
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1d8.strings);
        local_1d8.numbers.nStored = 0;
        (*(local_1d8.numbers.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_1d8.numbers.alloc.memoryResource,local_1d8.numbers.ptr,
                   local_1d8.numbers.nAlloc << 3,8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8.name._M_dataplus._M_p != &local_1d8.name.field_2) {
          operator_delete(local_1d8.name._M_dataplus._M_p,
                          local_1d8.name.field_2._M_allocated_capacity + 1);
        }
        local_108.type.field_2._M_allocated_capacity = local_1d8.type.field_2._M_allocated_capacity;
        local_108.type._M_dataplus._M_p = local_1d8.type._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8.type._M_dataplus._M_p == &local_1d8.type.field_2) {
          return __return_storage_ptr__;
        }
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)param);
        if ((iVar9 != 0) || ((param->strings).nStored == 0)) {
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          return __return_storage_ptr__;
        }
        ParsedParameter::ParsedParameter(&local_108,param);
        local_38 = &local_230;
        sVar3 = (param->strings).nStored;
        if (sVar3 == 0) {
          ErrorExit<std::__cxx11::string_const&>
                    (&param->loc,"No values provided for \"%s\".",&param->name);
        }
        param->lookedUp = true;
        std::vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>::vector
                  (__return_storage_ptr__,sVar3,(allocator_type *)local_250);
        lVar21 = 0;
        sVar20 = 0;
        do {
          name = (string *)((long)&(((param->strings).ptr)->_M_dataplus)._M_p + lVar21);
          GetNamedSpectrum((pbrt *)&local_220,name);
          if ((local_220.bits & 0xffffffffffff) == 0) {
            alloc_00.memoryResource = *local_38;
            ResolveFilename((string *)local_250,name);
            iVar12 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                             *)cachedSpectra_abi_cxx11_,(key_type *)local_250);
            if (iVar12._M_node == (_Base_ptr)(cachedSpectra_abi_cxx11_ + 8)) {
              PiecewiseLinearSpectrum::Read(&local_218,(string *)local_250,alloc_00);
              if ((char)local_218.lambdas.ptr == '\0') {
                uVar14 = 0;
              }
              else {
                pmVar13 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                                        *)cachedSpectra_abi_cxx11_,(key_type *)local_250);
                uVar14 = CONCAT44(local_218.lambdas.alloc.memoryResource._4_4_,
                                  local_218.lambdas.alloc.memoryResource._0_4_);
                (pmVar13->
                super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                ).bits = uVar14;
                if ((char)local_218.lambdas.ptr == '\0') {
                  LogFatal<char_const(&)[4]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                             ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
                }
              }
            }
            else {
              pmVar13 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumHandle>_>_>
                                      *)cachedSpectra_abi_cxx11_,(key_type *)local_250);
              uVar14 = (pmVar13->
                       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                       ).bits;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._0_8_ != &local_240) {
              operator_delete((void *)local_250._0_8_,local_240._M_allocated_capacity + 1);
            }
            local_220.bits = uVar14;
            if ((uVar14 & 0xffffffffffff) == 0) {
              ErrorExit<std::__cxx11::string_const&>
                        (&local_108.loc,"%s: unable to read valid spectrum file",name);
            }
          }
          lVar21 = lVar21 + 0x20;
          (__return_storage_ptr__->
          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>)._M_impl.
          super__Vector_impl_data._M_start[sVar20].
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          .bits = local_220.bits;
          sVar20 = sVar20 + 1;
        } while (sVar3 != sVar20);
        local_108.bools.nStored = 0;
        (*(local_108.bools.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_108.bools.alloc.memoryResource,local_108.bools.ptr,local_108.bools.nAlloc,1
                  );
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_108.strings);
        local_108.numbers.nStored = 0;
        (*(local_108.numbers.alloc.memoryResource)->_vptr_memory_resource[3])
                  (local_108.numbers.alloc.memoryResource,local_108.numbers.ptr,
                   local_108.numbers.nAlloc << 3,8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.name._M_dataplus._M_p != &local_108.name.field_2) {
          operator_delete(local_108.name._M_dataplus._M_p,
                          local_108.name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108.type._M_dataplus._M_p == &local_108.type.field_2) {
          return __return_storage_ptr__;
        }
      }
      operator_delete(local_108.type._M_dataplus._M_p,
                      local_108.type.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SpectrumHandle> ParameterDictionary::extractSpectrumArray(
    const ParsedParameter &param, SpectrumType spectrumType, Allocator alloc) const {
    if (param.type == "rgb" || (Options->upgrade && param.type == "color"))
        return returnArray<SpectrumHandle>(
            param.numbers, param, 3,
            [this, spectrumType, &alloc, &param](const double *v,
                                                 const FileLoc *loc) -> SpectrumHandle {
                RGB rgb(v[0], v[1], v[2]);
                const RGBColorSpace &cs =
                    param.colorSpace ? *param.colorSpace : *colorSpace;
                if (spectrumType == SpectrumType::Reflectance) {
                    if (std::min({v[0], v[1], v[2]}) < 0 ||
                        std::max({v[0], v[1], v[2]}) > 1)
                        ErrorExit(&param.loc,
                                  "RGB reflectance parameter \"%s\" has "
                                  "parameter outside of [0,1].",
                                  param.name);
                    return alloc.new_object<RGBReflectanceSpectrum>(cs, rgb);
                } else {
                    CHECK(spectrumType == SpectrumType::General);
                    if (std::min({v[0], v[1], v[2]}) < 0)
                        ErrorExit(&param.loc,
                                  "RGB parameter \"%s\" has negative component value.");
                    return alloc.new_object<RGBSpectrum>(cs, rgb);
                }
            });
    else if (param.type == "blackbody")
        return returnArray<SpectrumHandle>(
            param.numbers, param, 1,
            [this, &alloc](const double *v, const FileLoc *loc) -> SpectrumHandle {
                return alloc.new_object<BlackbodySpectrum>(v[0]);
            });
    else if (param.type == "spectrum" && !param.numbers.empty()) {
        if (param.numbers.size() % 2 != 0)
            ErrorExit(&param.loc, "Found odd number of values for \"%s\"", param.name);

        int nSamples = param.numbers.size() / 2;
        return returnArray<SpectrumHandle>(
            param.numbers, param, param.numbers.size(),
            [this, nSamples, &alloc, param](const double *v,
                                            const FileLoc *Loc) -> SpectrumHandle {
                std::vector<Float> lambda(nSamples), value(nSamples);
                for (int i = 0; i < nSamples; ++i) {
                    if (i > 0 && v[2 * i] <= lambda[i - 1])
                        ErrorExit(&param.loc,
                                  "Spectrum description invalid: at %d'th entry, "
                                  "wavelengths aren't increasing: %f >= %f.",
                                  i - 1, lambda[i - 1], v[2 * i]);
                    lambda[i] = v[2 * i];
                    value[i] = v[2 * i + 1];
                }
                return alloc.new_object<PiecewiseLinearSpectrum>(lambda, value, alloc);
            });
    } else if (param.type == "spectrum" && !param.strings.empty())
        return returnArray<SpectrumHandle>(
            param.strings, param, 1,
            [param, &alloc](const std::string *s, const FileLoc *loc) -> SpectrumHandle {
                SpectrumHandle spd = GetNamedSpectrum(*s);
                if (spd)
                    return spd;

                spd = readSpectrumFromFile(*s, alloc);
                if (!spd)
                    ErrorExit(&param.loc, "%s: unable to read valid spectrum file", *s);
                return spd;
            });

    return {};
}